

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcFanOrder.c
# Opt level: O0

void Abc_NodeSortCubes(Abc_Obj_t *pNode,Vec_Ptr_t *vCubes,Vec_Str_t *vStore,int fWeight)

{
  char *__dest;
  int iVar1;
  int iVar2;
  void *__src;
  char *__src_00;
  int local_44;
  int nVars;
  int i;
  char *pSop;
  char *pPivot;
  char *pCube;
  int fWeight_local;
  Vec_Str_t *vStore_local;
  Vec_Ptr_t *vCubes_local;
  Abc_Obj_t *pNode_local;
  
  __dest = (char *)(pNode->field_5).pData;
  iVar1 = Abc_ObjFaninNum(pNode);
  Vec_PtrClear(vCubes);
  pPivot = __dest;
  while( true ) {
    if (*pPivot == '\0') {
      if (fWeight == 0) {
        Vec_PtrSort(vCubes,Abc_NodeCompareCubes1);
      }
      else {
        Vec_PtrSort(vCubes,Abc_NodeCompareCubes2);
      }
      iVar2 = Vec_PtrSize(vCubes);
      Vec_StrGrow(vStore,iVar2 * (iVar1 + 3));
      pSop = Vec_StrArray(vStore);
      local_44 = 0;
      while( true ) {
        iVar2 = Vec_PtrSize(vCubes);
        if (iVar2 <= local_44) {
          __src_00 = Vec_StrArray(vStore);
          iVar2 = Vec_PtrSize(vCubes);
          memcpy(__dest,__src_00,(long)(iVar2 * (iVar1 + 3)));
          return;
        }
        __src = Vec_PtrEntry(vCubes,local_44);
        if (*(char *)((long)__src + (long)iVar1) != '\0') break;
        *(undefined1 *)((long)__src + (long)iVar1) = 0x20;
        memcpy(pSop,__src,(long)(iVar1 + 3));
        pSop = pSop + (iVar1 + 3);
        local_44 = local_44 + 1;
      }
      __assert_fail("pCube[nVars] == 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                    ,0x1e6,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
    }
    if (pPivot[iVar1] != ' ') break;
    pPivot[iVar1] = '\0';
    Vec_PtrPush(vCubes,pPivot);
    pPivot = pPivot + (iVar1 + 3);
  }
  __assert_fail("pCube[nVars] == \' \'",
                "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/abc/abcFanOrder.c"
                ,0x1da,"void Abc_NodeSortCubes(Abc_Obj_t *, Vec_Ptr_t *, Vec_Str_t *, int)");
}

Assistant:

void Abc_NodeSortCubes( Abc_Obj_t * pNode, Vec_Ptr_t * vCubes, Vec_Str_t * vStore, int fWeight )
{
    char * pCube, * pPivot;
    char * pSop = (char *)pNode->pData;
    int i, nVars = Abc_ObjFaninNum(pNode);
    Vec_PtrClear( vCubes );
    Abc_SopForEachCube( pSop, nVars, pCube )
    {
        assert( pCube[nVars] == ' ' );
        pCube[nVars] = 0;
        Vec_PtrPush( vCubes, pCube );
    }
    if ( fWeight )
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes2 );
    else
        Vec_PtrSort( vCubes, (int (*)())Abc_NodeCompareCubes1 );
    Vec_StrGrow( vStore, Vec_PtrSize(vCubes) * (nVars + 3) );
    pPivot = Vec_StrArray( vStore );
    Vec_PtrForEachEntry( char *, vCubes, pCube, i )
    {
        assert( pCube[nVars] == 0 );
        pCube[nVars] = ' ';
        memcpy( pPivot, pCube, (size_t)(nVars + 3) );
        pPivot += nVars + 3;
    }
    memcpy( pSop, Vec_StrArray(vStore), (size_t)(Vec_PtrSize(vCubes) * (nVars + 3)) );
}